

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Bac_ManWriteConstBit(Bac_Ntk_t *p,int iObj,int fHead)

{
  Vec_Str_t *p_00;
  int iVar1;
  
  p_00 = p->pDesign->vOut;
  iVar1 = Bac_ObjGetConst(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Const",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xe4,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
  }
  if (fHead != 0) {
    Vec_StrPrintStr(p_00,"1\'b");
  }
  if (iVar1 - 6U < 4) {
    Vec_StrPush(p_00,(char)(0x7a783130 >> ((char)(iVar1 - 6U) * '\b' & 0x1fU)));
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                ,0xef,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
}

Assistant:

static inline void Bac_ManWriteConstBit( Bac_Ntk_t * p, int iObj, int fHead )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int Const = Bac_ObjGetConst(p, iObj);
    assert( Const );
    if ( fHead )
        Vec_StrPrintStr( vStr, "1\'b" );
    if ( Const == BAC_BOX_CF )
        Vec_StrPush( vStr, '0' );
    else if ( Const == BAC_BOX_CT )
        Vec_StrPush( vStr, '1' );
    else if ( Const == BAC_BOX_CX )
        Vec_StrPush( vStr, 'x' );
    else if ( Const == BAC_BOX_CZ )
        Vec_StrPush( vStr, 'z' );
    else assert( 0 );
}